

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

bool __thiscall PSBTOutput::IsNull(PSBTOutput *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  bool local_11;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  local_11 = false;
  if (bVar2) {
    bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    local_11 = false;
    if (bVar2) {
      bVar2 = std::
              map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
              ::empty((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
                       *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
      local_11 = false;
      if (bVar2) {
        local_11 = std::
                   map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ::empty((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_11;
}

Assistant:

bool PSBTOutput::IsNull() const
{
    return redeem_script.empty() && witness_script.empty() && hd_keypaths.empty() && unknown.empty();
}